

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::match_times(Token *__return_storage_ptr__,Lexer *this)

{
  Position local_78;
  TokenPosition local_68;
  Type local_4c;
  Position local_48;
  TokenPosition local_38;
  Type local_20;
  bool local_1a;
  bool local_19;
  Lexer *local_18;
  Lexer *this_local;
  
  local_19 = false;
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  consume(this,&local_19);
  if (this->current_ == '/') {
    local_1a = true;
    consume(this,&local_1a);
    local_20 = kRightBlockComment;
    Position::Position(&local_48,&(this->position_).super_Position);
    TokenPosition::TokenPosition(&local_38,&local_48,2);
    Token::Token(__return_storage_ptr__,&local_20,&local_38);
  }
  else {
    local_4c = kTimes;
    Position::Position(&local_78,&(this->position_).super_Position);
    TokenPosition::TokenPosition(&local_68,&local_78,1);
    Token::Token(__return_storage_ptr__,&local_4c,&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_times() {
    consume(false);
    if (current_ == '/') {
        consume();
        return Token(Token::Type::kRightBlockComment, TokenPosition(position_, 2));
    } else {
        return Token(Token::Type::kTimes, TokenPosition(position_, 1));
    }
}